

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_blake256.c
# Opt level: O2

void blake256_compress(state_conflict *S,uint8_t *block)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint32_t m [16];
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_b8 [16];
  uint local_78 [16];
  state_conflict *local_38;
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    uVar5 = *(uint *)(block + lVar1 * 4);
    local_78[lVar1] =
         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    local_b8[lVar1] = S->h[lVar1];
  }
  if (S->nullt == 0) {
    local_b8[0xc] = S->t[0] ^ 0xa4093822;
    local_e8 = S->t[0] ^ 0x299f31d0;
    local_e0 = S->t[1] ^ 0x82efa98;
    local_dc = S->t[1] ^ 0xec4e6c89;
  }
  else {
    local_b8[0xc] = 0xa4093822;
    local_e8 = 0x299f31d0;
    local_e0 = 0x82efa98;
    local_dc = 0xec4e6c89;
  }
  local_b8[8] = S->s[0] ^ 0x243f6a88;
  local_e4 = S->s[1] ^ 0x85a308d3;
  local_d0 = S->s[2] ^ 0x13198a2e;
  local_38 = S;
  local_ec = S->s[3] ^ 0x3707344;
  local_d4 = local_b8[7];
  local_d8 = local_b8[3];
  for (lVar1 = 0xf; lVar1 != 0xef; lVar1 = lVar1 + 0x10) {
    uVar5 = local_b8[0] + local_b8[4] +
            (cst[(byte)(&UNK_001970d2)[lVar1]] ^ local_78[(byte)(&UNK_001970d1)[lVar1]]);
    local_b8[0xc] = local_b8[0xc] ^ uVar5;
    uVar6 = local_b8[0xc] << 0x10 | local_b8[0xc] >> 0x10;
    local_b8[8] = local_b8[8] + uVar6;
    uVar12 = local_b8[4] ^ local_b8[8];
    uVar13 = uVar12 << 0x14 | uVar12 >> 0xc;
    uVar12 = (cst[(byte)(&UNK_001970d1)[lVar1]] ^ local_78[(byte)(&UNK_001970d2)[lVar1]]) + uVar5 +
             uVar13;
    uVar6 = uVar6 ^ uVar12;
    uVar7 = uVar6 << 0x18 | uVar6 >> 8;
    local_b8[8] = local_b8[8] + uVar7;
    uVar13 = uVar13 ^ local_b8[8];
    uVar14 = uVar13 << 0x19 | uVar13 >> 7;
    uVar5 = local_b8[1] + local_b8[5] +
            (cst[(byte)(&UNK_001970d4)[lVar1]] ^ local_78[(byte)(&UNK_001970d3)[lVar1]]);
    local_e8 = local_e8 ^ uVar5;
    uVar10 = local_e8 << 0x10 | local_e8 >> 0x10;
    local_e4 = local_e4 + uVar10;
    uVar6 = local_b8[5] ^ local_e4;
    uVar13 = uVar6 << 0x14 | uVar6 >> 0xc;
    uVar6 = (cst[(byte)(&UNK_001970d3)[lVar1]] ^ local_78[(byte)(&UNK_001970d4)[lVar1]]) + uVar5 +
            uVar13;
    uVar10 = uVar10 ^ uVar6;
    uVar11 = uVar10 << 0x18 | uVar10 >> 8;
    local_e4 = local_e4 + uVar11;
    uVar13 = uVar13 ^ local_e4;
    uVar2 = uVar13 << 0x19 | uVar13 >> 7;
    uVar10 = local_b8[2] + local_b8[6] +
             (cst[(byte)(&UNK_001970d6)[lVar1]] ^ local_78[(byte)(&UNK_001970d5)[lVar1]]);
    local_e0 = local_e0 ^ uVar10;
    uVar13 = local_e0 << 0x10 | local_e0 >> 0x10;
    local_d0 = local_d0 + uVar13;
    uVar5 = local_b8[6] ^ local_d0;
    uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
    uVar10 = (cst[(byte)(&UNK_001970d5)[lVar1]] ^ local_78[(byte)(&UNK_001970d6)[lVar1]]) + uVar10 +
             uVar5;
    uVar13 = uVar13 ^ uVar10;
    uVar3 = uVar13 << 0x18 | uVar13 >> 8;
    local_d0 = local_d0 + uVar3;
    uVar13 = local_d8 + local_d4 +
             (cst[(byte)(&UNK_001970d8)[lVar1]] ^ local_78[(byte)(&UNK_001970d7)[lVar1]]);
    local_dc = local_dc ^ uVar13;
    uVar8 = local_dc << 0x10 | local_dc >> 0x10;
    local_ec = local_ec + uVar8;
    local_d4 = local_d4 ^ local_ec;
    uVar4 = local_d4 << 0x14 | local_d4 >> 0xc;
    uVar13 = (cst[(byte)(&UNK_001970d7)[lVar1]] ^ local_78[(byte)(&UNK_001970d8)[lVar1]]) + uVar13 +
             uVar4;
    uVar8 = uVar8 ^ uVar13;
    uVar9 = uVar8 << 0x18 | uVar8 >> 8;
    local_ec = local_ec + uVar9;
    uVar4 = uVar4 ^ local_ec;
    uVar4 = uVar4 << 0x19 | uVar4 >> 7;
    uVar8 = (cst[sigma[0][lVar1]] ^ local_78[(byte)(&UNK_001970df)[lVar1]]) + uVar13 + uVar14;
    uVar3 = uVar3 ^ uVar8;
    uVar10 = (cst[(byte)(&UNK_001970de)[lVar1]] ^ local_78[(byte)(&UNK_001970dd)[lVar1]]) + uVar10 +
             uVar4;
    uVar11 = uVar11 ^ uVar10;
    uVar12 = (cst[(byte)(&UNK_001970da)[lVar1]] ^ local_78[(byte)(&UNK_001970d9)[lVar1]]) + uVar12 +
             uVar2;
    uVar9 = uVar9 ^ uVar12;
    uVar5 = uVar5 ^ local_d0;
    uVar5 = uVar5 << 0x19 | uVar5 >> 7;
    uVar13 = uVar3 << 0x10 | uVar3 >> 0x10;
    local_e4 = local_e4 + uVar13;
    uVar14 = uVar14 ^ local_e4;
    uVar3 = uVar14 << 0x14 | uVar14 >> 0xc;
    local_d8 = (cst[(byte)(&UNK_001970df)[lVar1]] ^ local_78[sigma[0][lVar1]]) + uVar8 + uVar3;
    uVar13 = uVar13 ^ local_d8;
    local_e0 = uVar13 << 0x18 | uVar13 >> 8;
    local_e4 = local_e4 + local_e0;
    uVar3 = uVar3 ^ local_e4;
    local_b8[4] = uVar3 << 0x19 | uVar3 >> 7;
    uVar3 = uVar11 << 0x10 | uVar11 >> 0x10;
    local_b8[8] = local_b8[8] + uVar3;
    uVar4 = uVar4 ^ local_b8[8];
    uVar13 = uVar4 << 0x14 | uVar4 >> 0xc;
    local_b8[2] = (cst[(byte)(&UNK_001970dd)[lVar1]] ^ local_78[(byte)(&UNK_001970de)[lVar1]]) +
                  uVar10 + uVar13;
    uVar3 = uVar3 ^ local_b8[2];
    local_e8 = uVar3 << 0x18 | uVar3 >> 8;
    local_b8[8] = local_b8[8] + local_e8;
    uVar13 = uVar13 ^ local_b8[8];
    local_d4 = uVar13 << 0x19 | uVar13 >> 7;
    uVar10 = uVar9 << 0x10 | uVar9 >> 0x10;
    local_d0 = local_d0 + uVar10;
    uVar2 = uVar2 ^ local_d0;
    uVar13 = uVar2 << 0x14 | uVar2 >> 0xc;
    local_b8[0] = (cst[(byte)(&UNK_001970d9)[lVar1]] ^ local_78[(byte)(&UNK_001970da)[lVar1]]) +
                  uVar12 + uVar13;
    uVar10 = uVar10 ^ local_b8[0];
    local_dc = uVar10 << 0x18 | uVar10 >> 8;
    local_d0 = local_d0 + local_dc;
    uVar13 = uVar13 ^ local_d0;
    local_b8[5] = uVar13 << 0x19 | uVar13 >> 7;
    uVar12 = (cst[(byte)(&UNK_001970dc)[lVar1]] ^ local_78[(byte)(&UNK_001970db)[lVar1]]) + uVar6 +
             uVar5;
    uVar7 = uVar7 ^ uVar12;
    uVar6 = uVar7 << 0x10 | uVar7 >> 0x10;
    local_ec = local_ec + uVar6;
    uVar5 = uVar5 ^ local_ec;
    uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
    local_b8[1] = (cst[(byte)(&UNK_001970db)[lVar1]] ^ local_78[(byte)(&UNK_001970dc)[lVar1]]) +
                  uVar12 + uVar5;
    uVar6 = uVar6 ^ local_b8[1];
    local_b8[0xc] = uVar6 << 0x18 | uVar6 >> 8;
    local_ec = local_ec + local_b8[0xc];
    uVar5 = uVar5 ^ local_ec;
    local_b8[6] = uVar5 << 0x19 | uVar5 >> 7;
  }
  local_b8[0xd] = local_e8;
  local_b8[9] = local_e4;
  local_b8[0xe] = local_e0;
  local_b8[10] = local_d0;
  local_b8[7] = local_d4;
  local_b8[3] = local_d8;
  local_b8[0xf] = local_dc;
  local_b8[0xb] = local_ec;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    S->h[(uint)lVar1 & 7] = S->h[(uint)lVar1 & 7] ^ local_b8[lVar1];
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    S->h[lVar1] = S->h[lVar1] ^ S->s[(uint)lVar1 & 3];
  }
  return;
}

Assistant:

void blake256_compress(state *S, const uint8_t *block) {
    uint32_t v[16], m[16], i;

#define ROT(x,n) (((x)<<(32-n))|((x)>>(n)))
#define G(a,b,c,d,e)                                      \
    v[a] += (m[sigma[i][e]] ^ cst[sigma[i][e+1]]) + v[b]; \
    v[d] = ROT(v[d] ^ v[a],16);                           \
    v[c] += v[d];                                         \
    v[b] = ROT(v[b] ^ v[c],12);                           \
    v[a] += (m[sigma[i][e+1]] ^ cst[sigma[i][e]])+v[b];   \
    v[d] = ROT(v[d] ^ v[a], 8);                           \
    v[c] += v[d];                                         \
    v[b] = ROT(v[b] ^ v[c], 7);

    for (i = 0; i < 16; ++i) m[i] = U8TO32(block + i * 4);
    for (i = 0; i < 8;  ++i) v[i] = S->h[i];
    v[ 8] = S->s[0] ^ 0x243F6A88;
    v[ 9] = S->s[1] ^ 0x85A308D3;
    v[10] = S->s[2] ^ 0x13198A2E;
    v[11] = S->s[3] ^ 0x03707344;
    v[12] = 0xA4093822;
    v[13] = 0x299F31D0;
    v[14] = 0x082EFA98;
    v[15] = 0xEC4E6C89;

    if (S->nullt == 0) {
        v[12] ^= S->t[0];
        v[13] ^= S->t[0];
        v[14] ^= S->t[1];
        v[15] ^= S->t[1];
    }

    for (i = 0; i < 14; ++i) {
        G(0, 4,  8, 12,  0);
        G(1, 5,  9, 13,  2);
        G(2, 6, 10, 14,  4);
        G(3, 7, 11, 15,  6);
        G(3, 4,  9, 14, 14);
        G(2, 7,  8, 13, 12);
        G(0, 5, 10, 15,  8);
        G(1, 6, 11, 12, 10);
    }

    for (i = 0; i < 16; ++i) S->h[i % 8] ^= v[i];
    for (i = 0; i < 8;  ++i) S->h[i] ^= S->s[i % 4];
}